

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O2

int decodeInstruction(InternalInstruction *insn,byteReader_t reader,void *readerArg,
                     uint64_t startLoc,DisassemblerMode mode)

{
  VectorExtensionType VVar1;
  Reg RVar2;
  short sVar3;
  x86_op_id_pair *pxVar4;
  byte bVar5;
  uint8_t uVar6;
  int iVar7;
  int iVar8;
  uint64_t uVar9;
  ulong uVar10;
  byte bVar11;
  DisassemblerMode DVar12;
  ulong uVar13;
  short sVar14;
  uint uVar15;
  ulong uVar16;
  uint8_t uVar17;
  ushort uVar18;
  uint8_t *byte_00;
  uint8_t uVar19;
  OpcodeType OVar20;
  OperandSpecifier (*paOVar21) [6];
  OpcodeType OVar22;
  long lVar23;
  OpcodeType OVar24;
  ushort uVar25;
  bool bVar26;
  bool bVar27;
  long lStack_60;
  uint8_t byte;
  uint8_t byte1;
  uint8_t nextByte;
  undefined4 local_44;
  uint8_t byte2;
  OpcodeType local_3c;
  _Bool *local_38;
  
  insn->reader = reader;
  insn->readerArg = readerArg;
  insn->startLocation = startLoc;
  insn->readerCursor = startLoc;
  insn->mode = mode;
  _byte = _byte & 0xff00;
  insn->necessaryPrefixLocation = startLoc - 1;
  local_38 = &insn->isPrefix2e;
  bVar27 = true;
  local_44 = 0;
  local_3c = ONEBYTE;
  iVar8 = -1;
  bVar5 = 0;
  while (OVar20 = local_3c, bVar27) {
    if (insn->mode == MODE_64BIT) {
      iVar7 = consumeByte(insn,&byte);
      if (iVar7 != 0) {
        return -1;
      }
      if ((byte & 0xf0) == 0x40) {
        while( true ) {
          iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&byte,insn->readerCursor);
          if (iVar7 != 0) {
            return -1;
          }
          if ((byte & 0xf0) != 0x40) break;
          iVar7 = consumeByte(insn,&byte);
          if (iVar7 != 0) {
            return -1;
          }
        }
        if ((((byte - 0x2e < 0x3a) &&
             ((0x3c0000000010101U >> ((ulong)(byte - 0x2e) & 0x3f) & 1) != 0)) ||
            ((byte - 0xf0 < 4 && (byte - 0xf0 != 1)))) || (byte == '&')) goto LAB_0021c5fd;
      }
      insn->readerCursor = insn->readerCursor - 1;
    }
LAB_0021c5fd:
    uVar9 = insn->readerCursor;
    iVar7 = consumeByte(insn,&byte);
    if (iVar7 != 0) {
      return -1;
    }
    if ((byte & 0xfe) == 0xf2 && insn->readerCursor - 1 == insn->startLocation) {
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&nextByte,insn->readerCursor);
      if (iVar7 != 0) {
        return -1;
      }
      if ((((nextByte & 0xfffffff8) == 0x90) || (nextByte == 0xf0)) || ((nextByte & 0xfe) == 0x86))
      {
        insn->xAcquireRelease = true;
      }
      if (((byte == 0xf3) && (uVar15 = nextByte - 0x88, uVar15 < 0x40)) &&
         ((0xc000000000000003U >> ((ulong)uVar15 & 0x3f) & 1) != 0)) {
        insn->xAcquireRelease = true;
      }
      if (((nextByte & 0xf0) == 0x40) && (insn->mode == MODE_64BIT)) {
        iVar7 = consumeByte(insn,&nextByte);
        if (iVar7 != 0) {
          return -1;
        }
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&nextByte,insn->readerCursor);
        if (iVar7 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor - 1;
      }
    }
    if (byte - 100 < 4) {
      iVar8 = (*(code *)(&DAT_003cd2c0 + *(int *)(&DAT_003cd2c0 + (ulong)(byte - 100) * 4)))();
      return iVar8;
    }
    bVar5 = byte;
    if ((byte - 0xf0 < 4) && (byte - 0xf0 != 1)) {
      insn->isPrefixf3 = false;
      insn->isPrefixf0 = false;
      insn->isPrefixf2 = false;
      if (byte == 0xf3) {
        insn->isPrefixf3 = true;
        lStack_60 = 0x60;
LAB_0021c8b6:
        *(uint64_t *)(&insn->operandSize + lStack_60) = uVar9;
      }
      else {
        if (byte == 0xf2) {
          insn->isPrefixf2 = true;
          lStack_60 = 0x58;
          goto LAB_0021c8b6;
        }
        if (byte == 0xf0) {
          insn->isPrefixf0 = true;
          lStack_60 = 0x50;
          goto LAB_0021c8b6;
        }
      }
      insn->prefix0 = byte;
      bVar27 = true;
    }
    else if (byte == 0x26) {
      insn->segmentOverride = SEG_OVERRIDE_ES;
      local_38[4] = false;
      local_38[0] = false;
      local_38[1] = false;
      local_38[2] = false;
      local_38[3] = false;
      insn->isPrefix26 = true;
      insn->prefix26 = uVar9;
      insn->prefix1 = '&';
      bVar27 = true;
    }
    else if (byte == 0x2e) {
      insn->segmentOverride = SEG_OVERRIDE_CS;
      insn->isPrefix64 = false;
      insn->isPrefix65 = false;
      insn->isPrefix26 = false;
      insn->isPrefix2e = false;
      insn->isPrefix36 = false;
      insn->isPrefix3e = false;
      insn->isPrefix2e = true;
      insn->prefix2e = uVar9;
      insn->prefix1 = '.';
      bVar27 = true;
    }
    else if (byte == 0x36) {
      insn->segmentOverride = SEG_OVERRIDE_SS;
      insn->isPrefix64 = false;
      insn->isPrefix65 = false;
      insn->isPrefix26 = false;
      insn->isPrefix2e = false;
      insn->isPrefix36 = false;
      insn->isPrefix3e = false;
      insn->isPrefix36 = true;
      insn->prefix36 = uVar9;
      insn->prefix1 = '6';
      bVar27 = true;
    }
    else {
      bVar27 = false;
      if (byte == 0x3e) {
        insn->segmentOverride = SEG_OVERRIDE_DS;
        insn->isPrefix64 = false;
        insn->isPrefix65 = false;
        insn->isPrefix26 = false;
        insn->isPrefix2e = false;
        insn->isPrefix36 = false;
        insn->isPrefix3e = false;
        insn->isPrefix3e = true;
        insn->prefix3e = uVar9;
        insn->prefix1 = '>';
        bVar27 = true;
      }
    }
  }
  insn->vectorExtensionType = TYPE_NO_VEX_XOP;
  OVar22 = TWOBYTE;
  OVar24 = local_3c & 0xff;
  if (bVar5 == 0xc5) {
    iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&byte1,insn->readerCursor);
    if (iVar7 != 0) {
      return -1;
    }
    if ((insn->mode == MODE_64BIT) || (0xbf < byte1)) {
      insn->vectorExtensionType = TYPE_VEX_2B;
    }
    else {
      insn->readerCursor = insn->readerCursor - 1;
      if (insn->vectorExtensionType != TYPE_VEX_2B) goto LAB_0021caf6;
    }
    insn->vectorExtensionPrefix[0] = byte;
    iVar7 = consumeByte(insn,insn->vectorExtensionPrefix + 1);
    if (iVar7 != 0) {
      return -1;
    }
    bVar5 = insn->vectorExtensionPrefix[1];
    if (insn->mode == MODE_64BIT) {
      insn->rexPrefix = (byte)~bVar5 >> 5 & 4 | 0x40;
    }
    OVar20 = OVar24;
    if ((bVar5 & 3) == 1) {
      OVar20 = TWOBYTE;
    }
    goto LAB_0021caf6;
  }
  if (bVar5 == 0x8f) {
    iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&byte1,insn->readerCursor);
    if (iVar7 != 0) {
      return -1;
    }
    if ((byte1 & 0x38) == 0) {
      uVar9 = insn->readerCursor;
      insn->readerCursor = uVar9 - 1;
      bVar27 = insn->vectorExtensionType == TYPE_XOP;
      goto LAB_0021cdbd;
    }
    insn->vectorExtensionType = TYPE_XOP;
LAB_0021cbb7:
    insn->necessaryPrefixLocation = insn->readerCursor - 1;
LAB_0021cdca:
    insn->vectorExtensionPrefix[0] = byte;
    iVar7 = consumeByte(insn,insn->vectorExtensionPrefix + 1);
    if (iVar7 != 0) {
      return -1;
    }
    byte_00 = insn->vectorExtensionPrefix + 2;
LAB_0021cdf2:
    iVar7 = consumeByte(insn,byte_00);
    if (iVar7 != 0) {
      return -1;
    }
    bVar5 = insn->vectorExtensionPrefix[2];
    if (insn->mode == MODE_64BIT) {
      insn->rexPrefix = (byte)~insn->vectorExtensionPrefix[1] >> 5 | bVar5 >> 4 & 8 | 0x40;
    }
    OVar20 = OVar24;
    if ((bVar5 & 3) == 1) {
      OVar20 = OVar22;
    }
  }
  else if (bVar5 == 0xc4) {
    iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&byte1,insn->readerCursor);
    if (iVar7 != 0) {
      return -1;
    }
    if ((insn->mode == MODE_64BIT) || (0xbf < byte1)) {
      insn->vectorExtensionType = TYPE_VEX_3B;
      goto LAB_0021cbb7;
    }
    uVar9 = insn->readerCursor;
    insn->readerCursor = uVar9 - 1;
    bVar27 = insn->vectorExtensionType == TYPE_VEX_3B;
LAB_0021cdbd:
    insn->necessaryPrefixLocation = uVar9 - 2;
    if (bVar27) goto LAB_0021cdca;
  }
  else if (bVar5 == 0x62) {
    iVar7 = consumeByte(insn,&byte1);
    if (iVar7 != 0) {
      return -1;
    }
    if ((byte1 & 0xc) == 0 && (0xbf < byte1 || insn->mode == MODE_64BIT)) {
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&byte2,insn->readerCursor);
      if (iVar7 != 0) {
        return -1;
      }
      if ((byte2 & 4) == 0) {
        uVar9 = insn->readerCursor;
        insn->readerCursor = uVar9 - 2;
        insn->necessaryPrefixLocation = uVar9 - 4;
        if (insn->vectorExtensionType != TYPE_EVEX) goto LAB_0021caf6;
      }
      else {
        insn->vectorExtensionType = TYPE_EVEX;
      }
      insn->vectorExtensionPrefix[0] = byte;
      insn->vectorExtensionPrefix[1] = byte1;
      iVar7 = consumeByte(insn,insn->vectorExtensionPrefix + 2);
      if (iVar7 != 0) {
        return -1;
      }
      byte_00 = insn->vectorExtensionPrefix + 3;
      goto LAB_0021cdf2;
    }
    insn->readerCursor = insn->readerCursor - 2;
  }
  else {
    if ((insn->mode == MODE_64BIT) && ((bVar5 & 0xf0) == 0x40)) {
      while( true ) {
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&byte1,insn->readerCursor);
        if (iVar7 != 0) {
          return -1;
        }
        if ((byte1 & 0xf0) != 0x40) break;
        iVar7 = consumeByte(insn,&byte);
        if (iVar7 != 0) {
          return -1;
        }
      }
      insn->rexPrefix = byte;
      uVar9 = insn->readerCursor;
    }
    else {
      uVar9 = insn->readerCursor;
      insn->readerCursor = uVar9 - 1;
    }
    insn->necessaryPrefixLocation = uVar9 - 2;
  }
LAB_0021caf6:
  DVar12 = insn->mode;
  bVar5 = ~(byte)local_44;
  bVar11 = ~(byte)OVar20;
  if (DVar12 == MODE_64BIT) {
    if ((insn->rexPrefix & 8) != 0) {
      insn->registerSize = '\b';
      uVar17 = (bVar5 & 1) * '\x04' + '\x04';
      uVar19 = '\x04';
      uVar6 = '\x04';
      goto LAB_0021cc49;
    }
    bVar11 = bVar11 & 1;
    uVar19 = bVar11 * '\x02' + '\x02';
    insn->registerSize = uVar19;
    insn->addressSize = (bVar5 & 1) * '\x04' + '\x04';
    insn->displacementSize = uVar19;
    insn->immediateSize = uVar19;
    if (insn->rexPrefix == 0) {
      uVar19 = bVar11 * '\x04' + '\x04';
    }
LAB_0021cc5d:
    insn->immSize = uVar19;
  }
  else {
    if (DVar12 == MODE_32BIT) {
      uVar19 = (bVar11 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar19;
      uVar17 = (bVar5 & 1) * '\x02' + '\x02';
      uVar6 = uVar17;
LAB_0021cc49:
      insn->addressSize = uVar17;
      insn->displacementSize = uVar6;
      insn->immediateSize = uVar19;
      goto LAB_0021cc5d;
    }
    if (DVar12 == MODE_16BIT) {
      uVar19 = ((byte)OVar20 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar19;
      uVar17 = ((byte)local_44 & 1) * '\x02' + '\x02';
      uVar6 = uVar17;
      goto LAB_0021cc49;
    }
  }
  insn->opcodeType = ONEBYTE;
  insn->firstByte = '\0';
  switch(insn->vectorExtensionType) {
  case TYPE_VEX_2B:
switchD_0021cc97_caseD_1:
    insn->twoByteEscape = '\x0f';
    break;
  case TYPE_VEX_3B:
    bVar5 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar5 != 3) {
      if (bVar5 == 2) {
        insn->twoByteEscape = '\x0f';
        insn->threeByteEscape = '8';
        goto switchD_0021ccbf_caseD_2;
      }
      if (bVar5 != 1) {
        return -1;
      }
      goto switchD_0021cc97_caseD_1;
    }
    insn->twoByteEscape = '\x0f';
    insn->threeByteEscape = ':';
switchD_0021ccbf_caseD_3:
    OVar22 = THREEBYTE_3A;
    break;
  case TYPE_EVEX:
    OVar22 = insn->vectorExtensionPrefix[1] & THREEBYTE_3A;
    switch(OVar22) {
    case ONEBYTE:
      return -1;
    case THREEBYTE_38:
switchD_0021ccbf_caseD_2:
      OVar22 = THREEBYTE_38;
      break;
    case THREEBYTE_3A:
      goto switchD_0021ccbf_caseD_3;
    }
    break;
  case TYPE_XOP:
    uVar15 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (2 < (byte)((char)uVar15 - 8U)) {
      return -1;
    }
    OVar22 = uVar15 - XOP8_MAP;
    break;
  default:
    iVar7 = consumeByte(insn,&byte);
    if (iVar7 != 0) {
      return -1;
    }
    insn->firstByte = byte;
    if (byte == '\x0f') {
      insn->twoByteEscape = '\x0f';
      iVar7 = consumeByte(insn,&byte);
      if (iVar7 != 0) {
        return -1;
      }
      if (byte == '\x0e') {
        insn->opcodeType = T3DNOW_MAP;
        insn->consumedModRM = true;
      }
      else if (byte == '\x0f') {
        iVar7 = readModRM(insn);
        if (iVar7 != 0) {
          return -1;
        }
        iVar7 = consumeByte(insn,&byte);
        if (iVar7 != 0) {
          return -1;
        }
        insn->opcodeType = T3DNOW_MAP;
      }
      else if (byte == ':') {
        insn->threeByteEscape = ':';
        iVar7 = consumeByte(insn,&byte);
        if (iVar7 != 0) {
          return -1;
        }
        insn->opcodeType = THREEBYTE_3A;
      }
      else if (byte == '8') {
        insn->threeByteEscape = '8';
        iVar7 = consumeByte(insn,&byte);
        if (iVar7 != 0) {
          return -1;
        }
        insn->opcodeType = THREEBYTE_38;
      }
      else {
        insn->opcodeType = TWOBYTE;
      }
    }
    insn->opcode = byte;
    goto LAB_0021ce87;
  }
  insn->opcodeType = OVar22;
  iVar7 = consumeByte(insn,&insn->opcode);
  if (iVar7 != 0) {
    return -1;
  }
LAB_0021ce87:
  DVar12 = insn->mode;
  VVar1 = insn->vectorExtensionType;
  uVar18 = (ushort)(DVar12 == MODE_64BIT);
  uVar25 = (ushort)(DVar12 == MODE_64BIT);
  if (VVar1 == TYPE_NO_VEX_XOP) {
    if (DVar12 == MODE_16BIT) {
      uVar9 = insn->necessaryPrefixLocation;
    }
    else {
      uVar9 = insn->necessaryPrefixLocation;
      if ((insn->isPrefix66 == true) && (insn->prefix66 == uVar9)) {
        uVar25 = uVar18 | 0x10;
        goto LAB_0021d05f;
      }
    }
    if ((insn->isPrefix67 == true) && (insn->prefix67 == uVar9)) {
      uVar25 = uVar18 | 0x20;
    }
    else if (DVar12 != MODE_16BIT) {
      if ((insn->isPrefixf3 == true) && (insn->prefixf3 == uVar9)) {
        uVar25 = uVar18 | 2;
      }
      else if ((insn->isPrefixf2 == true) && (uVar25 = uVar18, insn->prefixf2 == uVar9)) {
        uVar25 = uVar18 + 4;
      }
    }
  }
  else {
    uVar25 = 0x40;
    if (VVar1 == TYPE_EVEX) {
      uVar25 = 0x100;
    }
    uVar25 = uVar25 | uVar18;
    if (VVar1 == TYPE_EVEX) {
      switch(insn->vectorExtensionPrefix[2] & 3) {
      case 1:
        uVar25 = uVar25 | 0x10;
        break;
      case 2:
        uVar25 = uVar25 | 2;
        break;
      case 3:
        uVar25 = uVar25 | 4;
      }
      bVar5 = insn->vectorExtensionPrefix[3];
      if ((char)bVar5 < '\0') {
        uVar25 = uVar25 + 0x1000;
      }
      sVar14 = (bVar5 & 0x10) * 0x200;
      sVar3 = sVar14 + 0x800;
      if ((bVar5 & 7) == 0) {
        sVar3 = sVar14;
      }
      uVar25 = (bVar5 & 0x60) << 4 | sVar3 + uVar25;
    }
    else {
      if (VVar1 == TYPE_VEX_2B) {
        uVar18 = (ushort)insn->vectorExtensionPrefix[1];
        switch(insn->vectorExtensionPrefix[1] & 3) {
        case 1:
          goto switchD_0021cf30_caseD_1;
        case 2:
          goto switchD_0021cf30_caseD_2;
        case 3:
          goto switchD_0021cf30_caseD_3;
        }
      }
      else if (VVar1 == TYPE_XOP) {
        uVar18 = (ushort)insn->vectorExtensionPrefix[2];
        switch(insn->vectorExtensionPrefix[2] & 3) {
        case 1:
          goto switchD_0021cf30_caseD_1;
        case 2:
          goto switchD_0021cf30_caseD_2;
        case 3:
          goto switchD_0021cf30_caseD_3;
        }
      }
      else {
        if (VVar1 != TYPE_VEX_3B) {
          return -1;
        }
        uVar18 = (ushort)insn->vectorExtensionPrefix[2];
        switch(insn->vectorExtensionPrefix[2] & 3) {
        case 1:
switchD_0021cf30_caseD_1:
          uVar25 = uVar25 | 0x10;
          break;
        case 2:
switchD_0021cf30_caseD_2:
          uVar25 = uVar25 | 2;
          break;
        case 3:
switchD_0021cf30_caseD_3:
          uVar25 = uVar25 | 4;
        }
      }
      uVar25 = uVar25 | (uVar18 & 4) << 5;
    }
  }
LAB_0021d05f:
  uVar25 = uVar25 | insn->rexPrefix & 8;
  uVar18 = uVar25;
  if (((DVar12 == MODE_16BIT) && (insn->opcodeType == ONEBYTE)) &&
     (uVar18 = uVar25 ^ 0x20, insn->opcode != 0xe3)) {
    uVar18 = uVar25;
  }
  iVar7 = getIDWithAttrMask((uint16_t *)&byte,insn,uVar18);
  if (iVar7 != 0) {
    return -1;
  }
  if (((insn->mode == MODE_64BIT) ||
      (((VVar1 = insn->vectorExtensionType, VVar1 != TYPE_VEX_3B && (VVar1 != TYPE_XOP)) &&
       (VVar1 != TYPE_EVEX)))) || (-1 < (char)insn->vectorExtensionPrefix[2])) {
LAB_0021d0de:
    uVar25 = _byte;
    if (insn->opcodeType == ONEBYTE) {
      DVar12 = insn->mode;
      if ((insn->opcode & 0xfc) != 0xa0) goto LAB_0021d142;
      uVar25 = uVar18 | 0x20;
      if (insn->isPrefix67 == false) {
        uVar25 = uVar18;
      }
      uVar18 = uVar25 | 0x10;
      if (insn->isPrefix66 == false) {
        uVar18 = uVar25;
      }
      uVar25 = uVar18 ^ 0x30;
      if (DVar12 != MODE_16BIT) {
        uVar25 = uVar18;
      }
      iVar7 = getIDWithAttrMask((uint16_t *)&byte,insn,uVar25);
      if (iVar7 != 0) {
        return -1;
      }
LAB_0021d1b8:
      uVar10 = (ulong)_byte;
      insn->instructionID = _byte;
      uVar25 = _byte;
      goto LAB_0021d2b2;
    }
    DVar12 = insn->mode;
LAB_0021d142:
    if (DVar12 == MODE_16BIT) {
      if ((uVar18 & 0x10) == 0) goto LAB_0021d152;
LAB_0021d1a1:
      if (((insn->opcodeType != ONEBYTE) || (insn->opcode != 0x90)) || ((insn->rexPrefix & 1) == 0))
      goto LAB_0021d1b8;
      insn->opcode = 0x91;
      iVar7 = getIDWithAttrMask((uint16_t *)&nextByte,insn,uVar18);
      if (iVar7 == 0) {
        uVar25 = _nextByte;
      }
      insn->opcode = 0x90;
      insn->instructionID = uVar25;
      insn->spec = x86DisassemblerInstrSpecifiers + uVar25;
    }
    else {
      if (((uVar18 & 0x10) != 0) || (insn->isPrefix66 == false)) goto LAB_0021d1a1;
LAB_0021d152:
      uVar10 = (ulong)_byte;
      iVar7 = getIDWithAttrMask((uint16_t *)&nextByte,insn,uVar18 | 0x10);
      if ((iVar7 == 0) && (x86_16_bit_eq_lookup[uVar10] != 0)) {
        uVar13 = (ulong)_nextByte;
        uVar16 = (ulong)(x86_16_bit_eq_lookup[uVar10] - 1);
        do {
          if ((0x464 < uVar16) || (x86_16_bit_eq_tbl[uVar16].first != uVar25)) goto LAB_0021d187;
          pxVar4 = x86_16_bit_eq_tbl + uVar16;
          uVar16 = uVar16 + 1;
        } while (pxVar4->second != _nextByte);
        if (insn->isPrefix66 == (insn->mode == MODE_16BIT)) goto LAB_0021d187;
        insn->instructionID = _nextByte;
        uVar25 = _nextByte;
      }
      else {
LAB_0021d187:
        insn->instructionID = uVar25;
        uVar13 = uVar10;
      }
      insn->spec = x86DisassemblerInstrSpecifiers + uVar13;
    }
  }
  else {
    iVar7 = getIDWithAttrMask((uint16_t *)&nextByte,insn,uVar18 | 8);
    if (iVar7 == 0) {
      uVar10 = (ulong)_nextByte;
      if (is_64bit_insn[uVar10] != false) goto LAB_0021d0de;
      insn->instructionID = _nextByte;
      uVar25 = _nextByte;
    }
    else {
      insn->instructionID = _byte;
      uVar10 = (ulong)_byte;
      uVar25 = _byte;
    }
LAB_0021d2b2:
    insn->spec = x86DisassemblerInstrSpecifiers + uVar10;
  }
  if (uVar25 == 0) {
    return -1;
  }
  if (insn->isPrefixf0 == true) {
    if (((((((0x3e < uVar25 - 0x2239) ||
            ((0x70381c0e00291055U >> ((ulong)(uVar25 - 0x2239) & 0x3f) & 1) == 0)) &&
           ((0x36 < uVar25 - 0x23 ||
            ((0x700700381c0e07U >> ((ulong)(uVar25 - 0x23) & 0x3f) & 1) == 0)))) &&
          (((0x21 < uVar25 - 0x139 || ((0x333333333U >> ((ulong)(uVar25 - 0x139) & 0x3f) & 1) == 0))
           && ((0x3d < uVar25 - 0x731 ||
               ((0x3c0e550004000055U >> ((ulong)(uVar25 - 0x731) & 0x3f) & 1) == 0)))))) &&
         ((((0x1d < uVar25 - 0xb1 || ((0x381c0e07U >> (uVar25 - 0xb1 & 0x1f) & 1) == 0)) &&
           ((0x1d < uVar25 - 0xa0d || ((0x381c0e07U >> (uVar25 - 0xa0d & 0x1f) & 1) == 0)))) &&
          ((0x1d < uVar25 - 0xb12 || ((0x381c0e07U >> (uVar25 - 0xb12 & 0x1f) & 1) == 0)))))) &&
        ((0xe < uVar25 - 99 || ((0x7007U >> (uVar25 - 99 & 0x1f) & 1) == 0)))) &&
       ((((8 < uVar25 - 0x244 || ((0x1abU >> (uVar25 - 0x244 & 0x1f) & 1) == 0)) &&
         ((0xb < uVar25 - 0x775 || ((0xe07U >> (uVar25 - 0x775 & 0x1f) & 1) == 0)))) &&
        ((8 < uVar25 - 0x297 || ((0x149U >> (uVar25 - 0x297 & 0x1f) & 1) == 0)))))) {
      if (8 < uVar25 - 0x396) {
        return -1;
      }
      if ((0x149U >> (uVar25 - 0x396 & 0x1f) & 1) == 0) {
        return -1;
      }
    }
  }
  else if ((insn->isPrefixf2 == true) && (insn->twoByteEscape == '\x0f')) {
    insn->prefix0 = '\0';
  }
  switch(insn->vectorExtensionType) {
  case TYPE_VEX_2B:
    bVar5 = insn->vectorExtensionPrefix[1];
    break;
  case TYPE_VEX_3B:
  case TYPE_XOP:
    bVar5 = insn->vectorExtensionPrefix[2];
    break;
  case TYPE_EVEX:
    bVar5 = (insn->vectorExtensionPrefix[2] >> 3 & 0xf |
            insn->vectorExtensionPrefix[3] * '\x02' & 0x10) ^ 0x1f;
    goto LAB_0021d5a1;
  default:
    local_44 = 0;
    bVar27 = false;
    goto LAB_0021d5c8;
  }
  bVar5 = (byte)~bVar5 >> 3 & 0xf;
LAB_0021d5a1:
  RVar2 = bVar5 & MODRM_REG_BH;
  if (insn->mode == MODE_64BIT) {
    RVar2 = (uint)bVar5;
  }
  insn->vvvv = RVar2;
  bVar27 = RVar2 != MODRM_REG_AL;
  local_44 = 1;
LAB_0021d5c8:
  paOVar21 = x86OperandSets;
  lVar23 = 6;
  local_3c = 0;
  while (bVar26 = lVar23 != 0, lVar23 = lVar23 + -1, bVar26) {
    uVar10 = (ulong)insn->spec->operands;
    switch(((OperandSpecifier *)((long)paOVar21 + uVar10 * 6 * 2))->encoding) {
    case '\0':
    case '\x19':
    case '\x1d':
    case '\x1e':
    case '\x1f':
      break;
    case '\x01':
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\a':
    case '\b':
      iVar7 = readModRM(insn);
      if (iVar7 != 0) {
        return -1;
      }
      iVar7 = fixupReg(insn,(OperandSpecifier *)
                            ((long)paOVar21 + (ulong)insn->spec->operands * 6 * 2));
      if (iVar7 != 0) {
        return -1;
      }
      if ((((OperandSpecifier *)((long)paOVar21 + (ulong)insn->spec->operands * 6 * 2))->encoding !=
           '\x01') && (insn->eaDisplacement == EA_DISP_8)) {
        insn->displacement =
             insn->displacement <<
             (((OperandSpecifier *)((long)paOVar21 + (ulong)insn->spec->operands * 6 * 2))->encoding
              - 2 & 0x3f);
      }
      break;
    case '\t':
      if ((char)local_44 == '\0') {
        return -1;
      }
      iVar7 = fixupReg(insn,(OperandSpecifier *)((long)paOVar21 + uVar10 * 6 * 2));
      bVar27 = false;
      goto LAB_0021d793;
    case '\n':
      if (insn->vectorExtensionType != TYPE_EVEX) {
        return -1;
      }
      insn->writemask = insn->vectorExtensionPrefix[3] & MODRM_REG_BH;
      break;
    default:
      goto switchD_0021d610_caseD_b;
    case '\x11':
      if (local_3c == 0) {
        iVar7 = readImmediate(insn,'\x01');
        if (iVar7 != 0) {
          return -1;
        }
        local_3c = (OpcodeType)
                   ((((OperandSpecifier *)((long)paOVar21 + (ulong)insn->spec->operands * 6 * 2))->
                     type & 0xfe) == 0x38);
      }
      else {
        bVar5 = insn->numImmediatesConsumed;
        insn->immediates[bVar5] = (ulong)((uint)insn->immediates[(ulong)bVar5 - 1] & 0xf);
        insn->numImmediatesConsumed = bVar5 + 1;
        local_3c = 1;
      }
      break;
    case '\x12':
      uVar19 = '\x02';
      goto LAB_0021d78e;
    case '\x13':
      uVar19 = '\x04';
      goto LAB_0021d78e;
    case '\x14':
      uVar19 = '\b';
      goto LAB_0021d78e;
    case '\x15':
      uVar19 = '\x01';
      goto LAB_0021d74b;
    case '\x16':
      uVar19 = '\x02';
      goto LAB_0021d74b;
    case '\x17':
      uVar19 = '\x04';
      goto LAB_0021d74b;
    case '\x18':
      uVar19 = '\b';
      goto LAB_0021d74b;
    case '\x1a':
      uVar19 = insn->immediateSize;
LAB_0021d78e:
      iVar7 = readImmediate(insn,uVar19);
LAB_0021d793:
      if (iVar7 != 0) {
        return -1;
      }
      break;
    case '\x1b':
      iVar7 = readImmediate(insn,insn->addressSize);
      if (iVar7 != 0) {
        return -1;
      }
      insn->displacementOffset = insn->immediateOffset;
      insn->consumedDisplacement = true;
      insn->displacementSize = insn->immediateSize;
      insn->displacement = insn->immediates[(ulong)insn->numImmediatesConsumed - 1];
      insn->immediateOffset = '\0';
      insn->immediateSize = '\0';
      break;
    case '\x1c':
      uVar19 = '\0';
LAB_0021d74b:
      readOpcodeRegister(insn,uVar19);
    }
    paOVar21 = (OperandSpecifier (*) [6])((long)paOVar21 + 2);
  }
  if ((!bVar27) &&
     (uVar10 = insn->readerCursor - insn->startLocation, insn->length = uVar10, uVar10 < 0x10)) {
    if (insn->operandSize == '\0') {
      insn->operandSize = insn->registerSize;
    }
    insn->operands = x86OperandSets[insn->spec->operands];
    iVar8 = 0;
  }
switchD_0021d610_caseD_b:
  return iVar8;
}

Assistant:

int decodeInstruction(struct InternalInstruction *insn,
		byteReader_t reader,
		const void *readerArg,
		uint64_t startLoc,
		DisassemblerMode mode)
{
	insn->reader = reader;
	insn->readerArg = readerArg;
	insn->startLocation = startLoc;
	insn->readerCursor = startLoc;
	insn->mode = mode;

	if (readPrefixes(insn)       ||
			readOpcode(insn)         ||
			getID(insn)      ||
			insn->instructionID == 0 ||
			checkPrefix(insn) ||
			readOperands(insn))
		return -1;

	insn->length = (size_t)(insn->readerCursor - insn->startLocation);

	// instruction length must be <= 15 to be valid
	if (insn->length > 15)
		return -1;

	if (insn->operandSize == 0)
		insn->operandSize = insn->registerSize;

	insn->operands = &x86OperandSets[insn->spec->operands][0];

	// dbgprintf(insn, "Read from 0x%llx to 0x%llx: length %zu",
	// 		startLoc, insn->readerCursor, insn->length);

	//if (insn->length > 15)
	//	dbgprintf(insn, "Instruction exceeds 15-byte limit");

#if 0
	printf("\n>>> x86OperandSets = %lu\n", sizeof(x86OperandSets));
	printf(">>> x86DisassemblerInstrSpecifiers = %lu\n", sizeof(x86DisassemblerInstrSpecifiers));
	printf(">>> x86DisassemblerContexts = %lu\n", sizeof(x86DisassemblerContexts));
	printf(">>> modRMTable = %lu\n", sizeof(modRMTable));
	printf(">>> x86DisassemblerOneByteOpcodes = %lu\n", sizeof(x86DisassemblerOneByteOpcodes));
	printf(">>> x86DisassemblerTwoByteOpcodes = %lu\n", sizeof(x86DisassemblerTwoByteOpcodes));
	printf(">>> x86DisassemblerThreeByte38Opcodes = %lu\n", sizeof(x86DisassemblerThreeByte38Opcodes));
	printf(">>> x86DisassemblerThreeByte3AOpcodes = %lu\n", sizeof(x86DisassemblerThreeByte3AOpcodes));
	printf(">>> x86DisassemblerThreeByteA6Opcodes = %lu\n", sizeof(x86DisassemblerThreeByteA6Opcodes));
	printf(">>> x86DisassemblerThreeByteA7Opcodes= %lu\n", sizeof(x86DisassemblerThreeByteA7Opcodes));
	printf(">>> x86DisassemblerXOP8Opcodes = %lu\n", sizeof(x86DisassemblerXOP8Opcodes));
	printf(">>> x86DisassemblerXOP9Opcodes = %lu\n", sizeof(x86DisassemblerXOP9Opcodes));
	printf(">>> x86DisassemblerXOPAOpcodes = %lu\n\n", sizeof(x86DisassemblerXOPAOpcodes));
#endif

	return 0;
}